

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetItem::executePendingSort(QTreeWidgetItem *this)

{
  QTreeModel *pQVar1;
  QTreeModel *in_RDI;
  QTreeWidgetItem *unaff_retaddr;
  QTreeModel *model;
  
  pQVar1 = treeModel(unaff_retaddr,(QTreeWidget *)in_RDI);
  if (pQVar1 != (QTreeModel *)0x0) {
    QTreeModel::executePendingSort(in_RDI);
  }
  return;
}

Assistant:

void QTreeWidgetItem::executePendingSort() const
{
    if (QTreeModel *model = treeModel())
        model->executePendingSort();
}